

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::C_Verify(SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pData,CK_ULONG ulDataLen,
                 CK_BYTE_PTR pSignature,CK_ULONG ulSignatureLen)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Type TVar4;
  Session *this_00;
  MacAlgorithm *pMVar5;
  undefined4 extraout_var;
  AsymmetricAlgorithm *pAVar6;
  PublicKey *pPVar7;
  void *pvVar8;
  CK_ULONG CVar9;
  CK_RV CVar10;
  char *functionName;
  ByteString local_98;
  ByteString data;
  size_t paramLen;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pSignature == (CK_BYTE_PTR)0x0 || pData == (CK_BYTE_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar3 = Session::getOpType(this_00);
  if (iVar3 != 6) {
    return 0x91;
  }
  pMVar5 = Session::getMacOp(this_00);
  if (pMVar5 == (MacAlgorithm *)0x0) {
    pAVar6 = Session::getAsymmetricCryptoOp(this_00);
    TVar4 = Session::getMechanism(this_00);
    pPVar7 = Session::getPublicKey(this_00);
    pvVar8 = Session::getParameters(this_00,&paramLen);
    if ((pAVar6 == (AsymmetricAlgorithm *)0x0) ||
       (bVar1 = Session::getAllowSinglePartOp(this_00), pPVar7 == (PublicKey *)0x0 || !bVar1)) {
      Session::resetOp(this_00);
      return 0x91;
    }
    CVar9 = (**(code **)(*(long *)pPVar7 + 0x28))(pPVar7);
    if (CVar9 != ulSignatureLen) {
      functionName = "AsymVerify";
      iVar3 = 0x15b8;
      goto LAB_00137df2;
    }
    ByteString::ByteString(&data);
    if (TVar4 == RSA) {
      ByteString::wipe(&data,ulSignatureLen - ulDataLen);
    }
    ByteString::ByteString(&local_98,pData,ulDataLen);
    ByteString::operator+=(&data,&local_98);
    ByteString::~ByteString(&local_98);
    ByteString::ByteString(&local_98,pSignature,ulSignatureLen);
    bVar1 = Session::getAllowMultiPartOp(this_00);
    if (bVar1) {
      iVar3 = (*pAVar6->_vptr_AsymmetricAlgorithm[8])(pAVar6,&data);
      if ((char)iVar3 != '\0') {
        iVar3 = (*pAVar6->_vptr_AsymmetricAlgorithm[9])(pAVar6,&local_98);
        cVar2 = (char)iVar3;
        goto LAB_00137e45;
      }
    }
    else {
      iVar3 = (*pAVar6->_vptr_AsymmetricAlgorithm[6])
                        (pAVar6,pPVar7,&data,&local_98,(ulong)TVar4,pvVar8,paramLen);
      cVar2 = (char)iVar3;
LAB_00137e45:
      if (cVar2 != '\0') {
        Session::resetOp(this_00);
        CVar10 = 0;
        goto LAB_00137e62;
      }
    }
    Session::resetOp(this_00);
    CVar10 = 0xc0;
  }
  else {
    pMVar5 = Session::getMacOp(this_00);
    if ((pMVar5 == (MacAlgorithm *)0x0) || (bVar1 = Session::getAllowSinglePartOp(this_00), !bVar1))
    {
      Session::resetOp(this_00);
      return 0x91;
    }
    iVar3 = (*pMVar5->_vptr_MacAlgorithm[0xb])(pMVar5);
    if (CONCAT44(extraout_var,iVar3) != ulSignatureLen) {
      functionName = "MacVerify";
      iVar3 = 0x1587;
LAB_00137df2:
      softHSMLog(3,functionName,
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,iVar3,"The size of the signature differs from the size of the mechanism");
      Session::resetOp(this_00);
      return 0xc1;
    }
    ByteString::ByteString(&data,pData,ulDataLen);
    iVar3 = (*pMVar5->_vptr_MacAlgorithm[6])(pMVar5,&data);
    if ((char)iVar3 == '\0') {
      Session::resetOp(this_00);
      CVar10 = 5;
      goto LAB_00137e6c;
    }
    ByteString::ByteString(&local_98,pSignature,ulSignatureLen);
    iVar3 = (*pMVar5->_vptr_MacAlgorithm[7])(pMVar5,&local_98);
    Session::resetOp(this_00);
    CVar10 = 0xc0;
    if ((char)iVar3 != '\0') {
      CVar10 = 0;
    }
  }
LAB_00137e62:
  ByteString::~ByteString(&local_98);
LAB_00137e6c:
  ByteString::~ByteString(&data);
  return CVar10;
}

Assistant:

CK_RV SoftHSM::C_Verify(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pData, CK_ULONG ulDataLen, CK_BYTE_PTR pSignature, CK_ULONG ulSignatureLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pData == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pSignature == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_VERIFY)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacVerify(session, pData, ulDataLen,
				 pSignature, ulSignatureLen);
	else
		return AsymVerify(session, pData, ulDataLen,
				  pSignature, ulSignatureLen);
}